

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  __m128i *palVar50;
  __m128i *palVar51;
  __m128i *palVar52;
  __m128i *palVar53;
  __m128i *palVar54;
  __m128i *palVar55;
  __m128i *palVar56;
  __m128i *palVar57;
  int iVar58;
  uint uVar59;
  int iVar60;
  int iVar61;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int64_t *ptr_00;
  __m128i *palVar62;
  long *plVar63;
  int iVar64;
  int iVar65;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong extraout_RDX_05;
  __m128i *array;
  long extraout_XMM0_Qa;
  long lVar66;
  longlong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  long extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  long extraout_XMM0_Qb;
  long lVar67;
  longlong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  long extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i alVar73;
  __m128i alVar74;
  __m128i alVar75;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  __m128i vH_07;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i alVar76;
  __m128i alVar77;
  __m128i alVar78;
  __m128i alVar79;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  undefined8 in_stack_ffffffffffffefe8;
  long local_ff8;
  long local_ff0;
  ulong local_fe8;
  int local_fdc;
  long local_fd8;
  long local_fd0;
  int local_fc4;
  longlong lStack_fb8;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m128i cond_max;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int64_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t e;
  __m128i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxHL;
  __m128i vMaxHS;
  __m128i vMaxHM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m128i vOne;
  __m128i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int64_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_sse41_128_64",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_table_striped_profile_sse41_128_64","profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_sse41_128_64",
            "s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_table_striped_profile_sse41_128_64","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_striped_profile_sse41_128_64","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_striped_profile_sse41_128_64","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len - 1;
    ppVar4 = profile->matrix;
    iVar58 = (iVar1 + 1) / 2;
    iVar65 = (iVar1 + -1) % iVar58;
    uVar59 = ~((iVar1 + -1) / iVar58);
    iVar60 = uVar59 + 2;
    pvVar5 = (profile->profile64).score;
    pvVar6 = (profile->profile64).matches;
    pvVar7 = (profile->profile64).similar;
    if (-open < ppVar4->min) {
      alVar78[1] = (long)open;
    }
    else {
      alVar78[1] = -(long)ppVar4->min;
    }
    matches = alVar78[1] + -0x7fffffffffffffff;
    similar = 0;
    length = 0;
    vNegLimit[1] = 0;
    vMaxH[0] = matches;
    vMaxHM[1] = matches;
    vMaxHM[0] = matches;
    vMaxHS[1] = matches;
    vMaxHS[0] = matches;
    vMaxHL[1] = matches;
    vMaxHL[0] = matches;
    vPosMask[1] = matches;
    result = (parasail_result_t *)-(ulong)(iVar60 == 1);
    vPosMask[0] = -(ulong)(uVar59 == 0xfffffffe);
    iVar61 = s1_beg;
    _segNum = (parasail_profile_t *)parasail_result_new_table3(iVar58 * 2,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x2810802;
      uVar59 = 0;
      if (s1_beg != 0) {
        uVar59 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar59 | *(uint *)&_segNum->field_0xc;
      uVar59 = 0;
      if (s1_end != 0) {
        uVar59 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar59 | *(uint *)&_segNum->field_0xc;
      uVar59 = 0;
      if (s2_beg != 0) {
        uVar59 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar59 | *(uint *)&_segNum->field_0xc;
      uVar59 = 0;
      if (s2_end != 0) {
        uVar59 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar59 | *(uint *)&_segNum->field_0xc;
      uVar59 = *(uint *)&_segNum->field_0xc | 0x20000;
      alVar77[1] = (size_t)uVar59;
      *(uint *)&_segNum->field_0xc = uVar59;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar58);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar58);
      pvE = parasail_memalign___m128i(0x10,(long)iVar58);
      ptr = parasail_memalign___m128i(0x10,(long)iVar58);
      b = parasail_memalign___m128i(0x10,(long)iVar58);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar58);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar58);
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar73[0] = (long)iVar58;
        alVar73[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar73,alVar77[1]);
        alVar74[0] = (long)iVar58;
        alVar74[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar74,alVar77[1]);
        alVar75[0] = (long)iVar58;
        alVar75[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar75,alVar77[1]);
        alVar79[0] = (long)iVar58;
        alVar79[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar79,alVar77[1]);
        alVar76[0] = (long)iVar58;
        alVar76[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar76,alVar77[1]);
        c[0] = (ulong)iVar58;
        c[1] = extraout_RDX_04;
        array = b_01;
        parasail_memset___m128i(b_01,c,alVar77[1]);
        h.m[1]._4_4_ = 0;
        local_fe8 = extraout_RDX_05;
        for (k = 0; k < iVar58; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 2; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              uVar59 = h.m[1]._0_4_ * iVar58 + k;
              local_fe8 = (ulong)uVar59;
              local_fc4 = -(gap * uVar59) - open;
            }
            else {
              local_fc4 = 0;
            }
            local_fd8 = (long)local_fc4;
            local_fd0 = local_fd8;
            if (local_fd8 < -0x8000000000000000) {
              local_fd0 = -0x8000000000000000;
            }
            *(long *)((long)&e + (long)(int)h.m[1]._0_4_ * 8 + 8) = local_fd0;
            local_fd8 = local_fd8 - open;
            if (local_fd8 < -0x8000000000000000) {
              local_fd8 = -0x8000000000000000;
            }
            (&tmp)[(int)h.m[1]._0_4_] = local_fd8;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          alVar77[1] = (long)(int)h.m[1]._4_4_ * 0x10;
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_fdc = -(gap * (k + -1)) - open;
          }
          else {
            local_fdc = 0;
          }
          local_fe8 = (ulong)local_fdc;
          if ((long)local_fe8 < -0x8000000000000000) {
            local_fe8 = 0x8000000000000000;
          }
          alVar77[1] = (size_t)k;
          ptr_00[alVar77[1]] = local_fe8;
        }
        for (s1Len = 0; palVar57 = pvHLoad, palVar56 = pvHMStore, palVar55 = pvHMLoad,
            palVar54 = pvHSStore, palVar53 = pvHSLoad, palVar52 = pvHLStore, palVar51 = pvHLLoad,
            palVar50 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff1e8 = ZEXT816(0);
          stack0xfffffffffffff1d8 = ZEXT816(0);
          vFL[0] = 1;
          vH[1] = 1;
          vH[0] = pvHLoad[iVar58 + -1][0];
          auVar70._8_8_ = 0;
          auVar70._0_8_ = pvHMLoad[iVar58 + -1][0];
          stack0xfffffffffffff198 = (__m128i)(auVar70 << 0x40);
          auVar71._8_8_ = 0;
          auVar71._0_8_ = pvHSLoad[iVar58 + -1][0];
          stack0xfffffffffffff188 = (__m128i)(auVar71 << 0x40);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = pvHLLoad[iVar58 + -1][0];
          _vP = (__m128i)(auVar72 << 0x40);
          vH_dag[1] = ptr_00[s1Len];
          iVar64 = ppVar4->mapper[(byte)s2[s1Len]] * iVar58;
          iVar2 = ppVar4->mapper[(byte)s2[s1Len]];
          vH_07[0] = (ulong)s1Len;
          b_19[0] = (ulong)(byte)s2[vH_07[0]];
          iVar3 = ppVar4->mapper[b_19[0]];
          pvHMStore = pvHLoad;
          pvHLoad = palVar56;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar54;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar52;
          pvE = pvHLLoad;
          pvHLLoad = palVar50;
          vF_ext[1] = matches;
          vF[0] = matches;
          for (k = 0; k < iVar58; k = k + 1) {
            alVar75 = b[k];
            alVar77 = b[k];
            alVar79 = b_00[k];
            alVar73 = b_00[k];
            palVar62 = b_01 + k;
            alVar78[1] = (*palVar62)[0];
            b_13[1] = (*palVar62)[1];
            alVar74 = *palVar62;
            b_02[1] = (long)k * 0x10;
            plVar63 = (long *)((long)pvVar5 + b_02[1] + (long)iVar64 * 0x10);
            b_04[1] = *plVar63;
            lVar66 = plVar63[1];
            a[1] = vH_07[0];
            a[0] = (longlong)array;
            b_02[0] = b_19[0];
            alVar76 = _mm_max_epi64_rpl(a,b_02);
            b_03[0] = alVar76[1];
            a_00[1] = vH_07[0];
            a_00[0] = (longlong)array;
            b_03[1] = b_02[1];
            alVar76 = _mm_max_epi64_rpl(a_00,b_03);
            b_04[0] = alVar76[1];
            palVar56[k][0] = extraout_XMM0_Qa;
            palVar56[k][1] = extraout_XMM0_Qb;
            b_04[1] = -(ulong)(extraout_XMM0_Qa == vH_dag[1] + b_04[1]);
            b_02[1] = -(ulong)(extraout_XMM0_Qb == vH[0] + lVar66);
            lVar66 = -(ulong)(extraout_XMM0_Qa == vF_ext[1]);
            lVar67 = -(ulong)(extraout_XMM0_Qb == vF[0]);
            auVar36._8_8_ = lVar67;
            auVar36._0_8_ = lVar66;
            auVar70 = pblendvb((undefined1  [16])alVar77,stack0xfffffffffffff1e8,auVar36);
            plVar63 = (long *)((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar58) * 0x10);
            auVar35._8_8_ = vHM[0] + plVar63[1];
            auVar35._0_8_ = vHS[1] + *plVar63;
            auVar34._8_8_ = b_02[1];
            auVar34._0_8_ = b_04[1];
            auVar70 = pblendvb(auVar70,auVar35,auVar34);
            vHS[1] = auVar70._0_8_;
            vHM[0] = auVar70._8_8_;
            palVar54[k][0] = vHS[1];
            palVar54[k][1] = vHM[0];
            auVar33._8_8_ = lVar67;
            auVar33._0_8_ = lVar66;
            auVar71 = pblendvb((undefined1  [16])alVar73,stack0xfffffffffffff1d8,auVar33);
            plVar63 = (long *)((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar58) * 0x10);
            auVar32._8_8_ = vHS[0] + plVar63[1];
            auVar32._0_8_ = vHL[1] + *plVar63;
            auVar31._8_8_ = b_02[1];
            auVar31._0_8_ = b_04[1];
            auVar71 = pblendvb(auVar71,auVar32,auVar31);
            vHL[1] = auVar71._0_8_;
            vHS[0] = auVar71._8_8_;
            palVar52[k][0] = vHL[1];
            palVar52[k][1] = vHS[0];
            auVar30._8_8_ = lVar67;
            auVar30._0_8_ = lVar66;
            auVar72 = pblendvb((undefined1  [16])alVar74,stack0xfffffffffffff1c8,auVar30);
            auVar29._8_8_ = vHL[0] + 1;
            auVar29._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar28._8_8_ = b_02[1];
            auVar28._0_8_ = b_04[1];
            auVar72 = pblendvb(auVar72,auVar29,auVar28);
            b_04[1] = (long)k * 0x10;
            vP = auVar72._0_8_;
            vHL[0] = auVar72._8_8_;
            palVar50[k][0] = (longlong)vP;
            palVar50[k][1] = vHL[0];
            a_01[1] = vH_07[0];
            a_01[0] = (longlong)array;
            alVar77 = _mm_min_epi64_rpl(a_01,b_04);
            b_05[0] = alVar77[1];
            a_02[1] = vH_07[0];
            a_02[0] = (longlong)array;
            b_05[1] = b_04[1];
            alVar77 = _mm_max_epi64_rpl(a_02,b_05);
            b_06[0] = alVar77[1];
            a_03[1] = vH_07[0];
            a_03[0] = (longlong)array;
            b_06[1] = b_04[1];
            alVar77 = _mm_max_epi64_rpl(a_03,b_06);
            b_07[0] = alVar77[1];
            a_04[1] = vH_07[0];
            a_04[0] = (longlong)array;
            b_07[1] = b_04[1];
            alVar77 = _mm_max_epi64_rpl(a_04,b_07);
            b_08[0] = alVar77[1];
            a_05[1] = vH_07[0];
            a_05[0] = (longlong)array;
            b_08[1] = b_04[1];
            _mm_max_epi64_rpl(a_05,b_08);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar58;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 8),vH_00,
                            s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar58;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x10),vH_01,
                            s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar58;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x18),vH_02,
                            s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
            array = *((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
                     trace_del_table;
            vH_03[0] = (ulong)(uint)k;
            c[0] = (ulong)(uint)s1Len;
            vH_03[1]._0_4_ = iVar58;
            vH_03[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_03,s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8
                           );
            a_06[1] = vH_03[0];
            a_06[0] = (longlong)array;
            b_09[1] = c[0];
            b_09[0] = extraout_RDX_06;
            alVar77 = _mm_max_epi64_rpl(a_06,b_09);
            b_10[0] = alVar77[1];
            a_07[1] = vH_03[0];
            a_07[0] = (longlong)array;
            b_10[1] = c[0];
            alVar77 = _mm_cmpgt_epi64_rpl(a_07,b_10);
            alVar78[0] = alVar77[1];
            auVar27._8_8_ = extraout_XMM0_Qb_01;
            auVar27._0_8_ = extraout_XMM0_Qa_01;
            auVar72 = pblendvb((undefined1  [16])alVar75,auVar70,auVar27);
            auVar26._8_8_ = extraout_XMM0_Qb_01;
            auVar26._0_8_ = extraout_XMM0_Qa_01;
            auVar68 = pblendvb((undefined1  [16])alVar79,auVar71,auVar26);
            auVar25._8_8_ = b_13[1] + 1;
            auVar25._0_8_ = alVar78[1] + 1;
            auVar24._8_8_ = vHL[0] + 1;
            auVar24._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar23._8_8_ = extraout_XMM0_Qb_01;
            auVar23._0_8_ = extraout_XMM0_Qa_01;
            auVar69 = pblendvb(auVar25,auVar24,auVar23);
            ptr[k][0] = extraout_XMM0_Qa_00;
            ptr[k][1] = extraout_XMM0_Qb_00;
            vES[1] = auVar72._0_8_;
            vEM[0] = auVar72._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar68._0_8_;
            vES[0] = auVar68._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            alVar78[1] = (long)k * 0x10;
            vF[1] = auVar69._0_8_;
            vEL[0] = auVar69._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            a_08[1] = vH_03[0];
            a_08[0] = (longlong)array;
            alVar77 = _mm_max_epi64_rpl(a_08,alVar78);
            b_11[0] = alVar77[1];
            a_09[1] = vH_03[0];
            a_09[0] = (longlong)array;
            b_11[1] = alVar78[1];
            alVar78 = _mm_cmpgt_epi64_rpl(a_09,b_11);
            b_19[0] = alVar78[1];
            auVar22._8_8_ = extraout_XMM0_Qb_03;
            auVar22._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(stack0xfffffffffffff1e8,auVar70,auVar22);
            auVar21._8_8_ = extraout_XMM0_Qb_03;
            auVar21._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(stack0xfffffffffffff1d8,auVar71,auVar21);
            auVar20._8_8_ = vFL[0] + 1;
            auVar20._0_8_ = vH[1] + 1;
            auVar69._8_8_ = vHL[0] + 1;
            auVar69._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar68._8_8_ = extraout_XMM0_Qb_03;
            auVar68._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar20,auVar69,auVar68);
            vH_dag[1] = palVar57[k][0];
            vH[0] = palVar57[k][1];
            unique0x10003997 = palVar55[k];
            unique0x100039a7 = palVar53[k];
            _vP = palVar51[k];
            vH_07[0] = vH_03[0];
            vF_ext[1] = extraout_XMM0_Qa_02;
            vF[0] = extraout_XMM0_Qb_02;
          }
          for (end_query = 0; end_query < 2; end_query = end_query + 1) {
            vHp[0] = palVar57[iVar58 + -1][0];
            if (s2_beg == 0) {
              local_ff0 = ptr_00[s1Len + 1] - (long)open;
            }
            else {
              local_ff0 = (long)-open;
            }
            if (local_ff0 < -0x8000000000000000) {
              local_ff8 = -0x8000000000000000;
            }
            else {
              local_ff8 = local_ff0;
            }
            vF[0] = vF_ext[1];
            auVar40._8_8_ = 0;
            auVar40._0_8_ = vFS[1];
            stack0xfffffffffffff1e8 = auVar40 << 0x40;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = vFL[1];
            stack0xfffffffffffff1d8 = auVar41 << 0x40;
            tmp_6 = ptr_00[s1Len];
            vF_ext[1] = local_ff8;
            vFL[0] = vH[1];
            vH[1] = 1;
            for (k = 0; k < iVar58; k = k + 1) {
              plVar63 = (long *)((long)pvVar5 + (long)k * 0x10 + (long)iVar64 * 0x10);
              alVar78[1] = *plVar63;
              b_13[1] = plVar63[1];
              b_12[1] = (long)k * 0x10;
              a_10[1] = vH_07[0];
              a_10[0] = (longlong)array;
              b_12[0] = b_19[0];
              alVar77 = _mm_max_epi64_rpl(a_10,b_12);
              b_13[0] = alVar77[1];
              palVar56[k][0] = extraout_XMM0_Qa_04;
              palVar56[k][1] = extraout_XMM0_Qb_04;
              c[0] = ~-(ulong)(extraout_XMM0_Qa_04 == tmp_6 + alVar78[1]) &
                     -(ulong)(extraout_XMM0_Qa_04 == vF_ext[1]);
              b_19[0] = ~-(ulong)(extraout_XMM0_Qb_04 == vHp[0] + b_13[1]) &
                        -(ulong)(extraout_XMM0_Qb_04 == vF[0]);
              auVar19._8_8_ = b_19[0];
              auVar19._0_8_ = c[0];
              auVar70 = pblendvb((undefined1  [16])palVar54[k],stack0xfffffffffffff1e8,auVar19);
              vHS[1] = auVar70._0_8_;
              vHM[0] = auVar70._8_8_;
              palVar54[k][0] = vHS[1];
              palVar54[k][1] = vHM[0];
              auVar18._8_8_ = b_19[0];
              auVar18._0_8_ = c[0];
              auVar71 = pblendvb((undefined1  [16])palVar52[k],stack0xfffffffffffff1d8,auVar18);
              vHL[1] = auVar71._0_8_;
              vHS[0] = auVar71._8_8_;
              palVar52[k][0] = vHL[1];
              palVar52[k][1] = vHS[0];
              auVar17._8_8_ = b_19[0];
              auVar17._0_8_ = c[0];
              auVar72 = pblendvb((undefined1  [16])palVar50[k],stack0xfffffffffffff1c8,auVar17);
              b_13[1] = (long)k * 0x10;
              vP = auVar72._0_8_;
              vHL[0] = auVar72._8_8_;
              palVar50[k][0] = (longlong)vP;
              palVar50[k][1] = vHL[0];
              a_11[1] = vH_07[0];
              a_11[0] = (longlong)array;
              alVar78 = _mm_min_epi64_rpl(a_11,b_13);
              b_14[0] = alVar78[1];
              a_12[1] = vH_07[0];
              a_12[0] = (longlong)array;
              b_14[1] = b_13[1];
              alVar78 = _mm_max_epi64_rpl(a_12,b_14);
              b_15[0] = alVar78[1];
              a_13[1] = vH_07[0];
              a_13[0] = (longlong)array;
              b_15[1] = b_13[1];
              alVar78 = _mm_max_epi64_rpl(a_13,b_15);
              b_16[0] = alVar78[1];
              a_14[1] = vH_07[0];
              a_14[0] = (longlong)array;
              b_16[1] = b_13[1];
              alVar78 = _mm_max_epi64_rpl(a_14,b_16);
              b_17[0] = alVar78[1];
              a_15[1] = vH_07[0];
              a_15[0] = (longlong)array;
              b_17[1] = b_13[1];
              _mm_max_epi64_rpl(a_15,b_17);
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = iVar58;
              vH_04[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 8),vH_04,
                              s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
              vH_05[0] = (ulong)(uint)k;
              vH_05[1]._0_4_ = iVar58;
              vH_05[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x10),
                              vH_05,s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
              vH_06[0] = (ulong)(uint)k;
              vH_06[1]._0_4_ = iVar58;
              vH_06[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x18),
                              vH_06,s1Len,s2Len,iVar61,(int32_t)in_stack_ffffffffffffefe8);
              array = *((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
                       trace_del_table;
              vH_07[0] = (ulong)(uint)k;
              c[0] = (ulong)(uint)s1Len;
              vH_07[1]._0_4_ = iVar58;
              vH_07[1]._4_4_ = 0;
              arr_store_si128((int *)array,vH_07,s1Len,s2Len,iVar61,
                              (int32_t)in_stack_ffffffffffffefe8);
              vF_ext[1] = vF_ext[1] - gap;
              vF[0] = vF[0] - gap;
              a_16[1] = vH_07[0];
              a_16[0] = (longlong)array;
              b_18[1] = c[0];
              b_18[0] = extraout_RDX_07;
              alVar78 = _mm_cmpgt_epi64_rpl(a_16,b_18);
              b_19[0] = alVar78[1];
              vH_03[0] = extraout_XMM0_Qb_05 | -(ulong)(vF[0] == extraout_XMM0_Qb_04 - open);
              auVar39._8_8_ = vH_03[0];
              auVar39._0_8_ =
                   extraout_XMM0_Qa_05 | -(ulong)(vF_ext[1] == extraout_XMM0_Qa_04 - open);
              if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar39 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar39 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar39 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar39 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (vH_03[0] >> 7 & 1) == 0) && (vH_03[0] >> 0xf & 1) == 0) &&
                      (vH_03[0] >> 0x17 & 1) == 0) && (vH_03[0] >> 0x1f & 1) == 0) &&
                    (vH_03[0] >> 0x27 & 1) == 0) && (vH_03[0] >> 0x2f & 1) == 0) &&
                  (vH_03[0] >> 0x37 & 1) == 0) && -1 < (long)vH_03[0]) goto LAB_00a08355;
              a_17[1] = vH_07[0];
              a_17[0] = (longlong)array;
              b_19[1] = c[0];
              alVar78 = _mm_cmpgt_epi64_rpl(a_17,b_19);
              b_19[0] = alVar78[1];
              auVar16._8_8_ = extraout_XMM0_Qb_06;
              auVar16._0_8_ = extraout_XMM0_Qa_06;
              register0x00001240 = pblendvb(stack0xfffffffffffff1e8,auVar70,auVar16);
              auVar15._8_8_ = extraout_XMM0_Qb_06;
              auVar15._0_8_ = extraout_XMM0_Qa_06;
              register0x00001240 = pblendvb(stack0xfffffffffffff1d8,auVar71,auVar15);
              auVar14._8_8_ = vFL[0] + 1;
              auVar14._0_8_ = vH[1] + 1;
              auVar13._8_8_ = vHL[0] + 1;
              auVar13._0_8_ = (undefined1 *)((long)*vP + 1);
              auVar12._8_8_ = extraout_XMM0_Qb_06;
              auVar12._0_8_ = extraout_XMM0_Qa_06;
              register0x00001240 = pblendvb(auVar14,auVar13,auVar12);
              tmp_6 = palVar57[k][0];
              vHp[0] = palVar57[k][1];
            }
          }
LAB_00a08355:
          alVar78 = palVar56[iVar65];
          alVar73 = palVar54[iVar65];
          alVar74 = palVar52[iVar65];
          alVar77[1] = (long)iVar65 * 0x10;
          alVar75 = palVar50[iVar65];
          a_18[1] = vH_07[0];
          a_18[0] = (longlong)array;
          alVar77[0] = b_19[0];
          alVar79 = _mm_cmpgt_epi64_rpl(a_18,alVar77);
          local_fe8 = alVar79[1];
          auVar11._8_8_ = extraout_XMM0_Qb_07;
          auVar11._0_8_ = extraout_XMM0_Qa_07;
          register0x00001240 = pblendvb(stack0xfffffffffffff2f8,(undefined1  [16])alVar78,auVar11);
          auVar10._8_8_ = extraout_XMM0_Qb_07;
          auVar10._0_8_ = extraout_XMM0_Qa_07;
          register0x00001240 = pblendvb(stack0xfffffffffffff2e8,(undefined1  [16])alVar73,auVar10);
          auVar9._8_8_ = extraout_XMM0_Qb_07;
          auVar9._0_8_ = extraout_XMM0_Qa_07;
          register0x00001240 = pblendvb(stack0xfffffffffffff2d8,(undefined1  [16])alVar74,auVar9);
          auVar8._8_8_ = extraout_XMM0_Qb_07;
          auVar8._0_8_ = extraout_XMM0_Qa_07;
          register0x00001240 = pblendvb(stack0xfffffffffffff2c8,(undefined1  [16])alVar75,auVar8);
          c[0] = vPosMask[0] & extraout_XMM0_Qb_07;
          auVar38._8_8_ = c[0];
          auVar38._0_8_ = (ulong)result & extraout_XMM0_Qa_07;
          if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (c[0] >> 7 & 1) != 0) || (c[0] >> 0xf & 1) != 0) || (c[0] >> 0x17 & 1) != 0) ||
                 (c[0] >> 0x1f & 1) != 0) || (c[0] >> 0x27 & 1) != 0) || (c[0] >> 0x2f & 1) != 0) ||
              (c[0] >> 0x37 & 1) != 0) || (long)c[0] < 0) {
            matrix._0_4_ = s1Len;
          }
          c[0] = vH_07[0];
        }
        if (s2_end != 0) {
          end_query = 0;
          while( true ) {
            if (iVar60 <= end_query) break;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = vMaxHM[1];
            stack0xfffffffffffff2f8 = auVar42 << 0x40;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = vMaxHS[1];
            stack0xfffffffffffff2e8 = auVar43 << 0x40;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = vMaxHL[1];
            stack0xfffffffffffff2d8 = auVar44 << 0x40;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = vPosMask[1];
            stack0xfffffffffffff2c8 = auVar45 << 0x40;
            end_query = end_query + 1;
          }
          matches = vMaxH[0];
          similar = vMaxHM[0];
          length = vMaxHS[0];
          vNegLimit[1] = vMaxHL[0];
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          m = *pvHLoad;
          s = *pvHMLoad;
          l = *pvHSLoad;
          _temp = *pvHLLoad;
          k = 0;
          while( true ) {
            if (iVar58 * 2 <= k) break;
            uVar59 = (k % 2) * iVar58;
            local_fe8 = (ulong)uVar59;
            iVar61 = k / 2 + uVar59;
            if (iVar61 < iVar1) {
              if (matches < *m) {
                matches = *m;
                matrix._0_4_ = s2Len - 1;
                similar = *s;
                length = *l;
                vNegLimit[1] = *_temp;
                matrix._4_4_ = iVar61;
              }
              else if (((*m == matches) &&
                       (alVar77[1] = (size_t)(s2Len - 1U), (uint)matrix == s2Len - 1U)) &&
                      (iVar61 < matrix._4_4_)) {
                similar = *s;
                length = *l;
                vNegLimit[1] = *_temp;
                matrix._4_4_ = iVar61;
              }
            }
            k = k + 1;
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = _temp + 1;
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vHM_1[1] = pvHLoad[iVar65][0];
          vH_1[0] = pvHLoad[iVar65][1];
          vHS_1[1] = pvHMLoad[iVar65][0];
          vHM_1[0] = pvHMLoad[iVar65][1];
          vHL_1[1] = pvHSLoad[iVar65][0];
          vHS_1[0] = pvHSLoad[iVar65][1];
          alVar77[1] = (long)iVar65 * 0x10;
          lStack_fb8 = pvHLLoad[iVar65][0];
          vHL_1[0] = pvHLLoad[iVar65][1];
          for (end_query = 0; lVar49 = vHM_1[1], lVar48 = vHS_1[1], lVar47 = vHL_1[1],
              lVar46 = lStack_fb8, end_query < iVar60; end_query = end_query + 1) {
            vHM_1[1] = 0;
            vH_1[0] = lVar49;
            vHS_1[1] = 0;
            vHM_1[0] = lVar48;
            vHL_1[1] = 0;
            vHS_1[0] = lVar47;
            lStack_fb8 = 0;
            vHL_1[0] = lVar46;
          }
          matrix._0_4_ = s2Len - 1;
          matrix._4_4_ = iVar1 + -1;
          matches._0_4_ = (int)vH_1[0];
          similar._0_4_ = (int)vHM_1[0];
          length._0_4_ = (int)vHS_1[0];
          vNegLimit[1]._0_4_ = (int)vHL_1[0];
        }
        a_19[1] = c[0];
        a_19[0] = (longlong)array;
        b_20[1] = alVar77[1];
        b_20[0] = local_fe8;
        alVar78 = _mm_cmplt_epi64_rpl(a_19,b_20);
        b_21[0] = alVar78[1];
        a_20[1] = c[0];
        a_20[0] = (longlong)array;
        b_21[1] = alVar77[1];
        c[0] = extraout_XMM0_Qa_08;
        _mm_cmpgt_epi64_rpl(a_20,b_21);
        vH_07[0] = extraout_XMM0_Qb_08 | extraout_XMM0_Qb_09;
        auVar37._8_8_ = vH_07[0];
        auVar37._0_8_ = c[0] | extraout_XMM0_Qa_09;
        if ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar37 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar37 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar37 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar37 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar37 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (vH_07[0] >> 7 & 1) != 0) || (vH_07[0] >> 0xf & 1) != 0) ||
                (vH_07[0] >> 0x17 & 1) != 0) || (vH_07[0] >> 0x1f & 1) != 0) ||
              (vH_07[0] >> 0x27 & 1) != 0) || (vH_07[0] >> 0x2f & 1) != 0) ||
            (vH_07[0] >> 0x37 & 1) != 0) || (long)vH_07[0] < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          matches._0_4_ = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)matches;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (uint)matrix;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->matches =
             (int)similar;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxHM = _mm_slli_si128(vMaxHM, 8);
            vMaxHS = _mm_slli_si128(vMaxHS, 8);
            vMaxHL = _mm_slli_si128(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxHL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}